

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O0

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::ParquetWriteBind
          (ClientContext *context,CopyFunctionBindInput *input,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,vector<duckdb::LogicalType,_true> *sql_types)

{
  vector<duckdb::LogicalType,_true> *pvVar1;
  bool bVar2;
  LogicalTypeId LVar3;
  size_type sVar4;
  undefined8 uVar5;
  const_reference pvVar6;
  string *psVar7;
  LogicalType *pLVar8;
  idx_t iVar9;
  ulong uVar10;
  vector<duckdb::LogicalType,_true> *pvVar11;
  int64_t iVar12;
  long lVar13;
  BinderException *pBVar14;
  pointer pPVar15;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  long *in_RDX;
  ClientContext *in_RSI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> in_RDI;
  double dVar16;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_false,_true>,_bool>
  pVar17;
  string roption_2;
  int64_t val_4;
  string val_3;
  double val_2;
  uint64_t val_1;
  int64_t val;
  string key;
  value_type *value;
  idx_t i;
  vector<duckdb::Value,_true> values;
  LogicalType *kv_struct_type;
  value_type *kv_struct;
  idx_t col_idx;
  case_insensitive_map_t<LogicalType> name_to_type_map;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  unique_field_ids;
  idx_t field_id;
  string roption_1;
  value_type roption;
  string loption;
  value_type *option;
  const_iterator __end1;
  const_iterator __begin1;
  case_insensitive_map_t<vector<Value>_> *__range1;
  templated_unique_single_t bind_data;
  bool dictionary_size_limit_set;
  bool compression_level_set;
  bool row_group_size_bytes_set;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
  *in_stack_fffffffffffff638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff648;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *in_stack_fffffffffffff650;
  Value *in_stack_fffffffffffff660;
  allocator *paVar18;
  ClientContext *in_stack_fffffffffffff668;
  char *in_stack_fffffffffffff670;
  string *in_stack_fffffffffffff678;
  BinderException *in_stack_fffffffffffff680;
  string *in_stack_fffffffffffff688;
  BinderException *in_stack_fffffffffffff690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6a0;
  pointer in_stack_fffffffffffff6a8;
  undefined7 in_stack_fffffffffffff6b0;
  undefined1 in_stack_fffffffffffff6b7;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff728;
  const_reference in_stack_fffffffffffff730;
  undefined7 in_stack_fffffffffffff738;
  undefined1 in_stack_fffffffffffff73f;
  ChildFieldIDs *in_stack_fffffffffffff740;
  bool local_6b2;
  allocator local_561;
  string local_560 [8];
  case_insensitive_map_t<LogicalType> *in_stack_fffffffffffffaa8;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_fffffffffffffab0;
  ChildFieldIDs *in_stack_fffffffffffffab8;
  undefined6 in_stack_fffffffffffffac0;
  undefined1 in_stack_fffffffffffffac6;
  allocator in_stack_fffffffffffffac7;
  string local_538 [38];
  undefined1 local_512;
  allocator local_511;
  string local_510 [38];
  undefined1 local_4ea;
  allocator local_4e9;
  string local_4e8 [32];
  string local_4c8 [32];
  string local_4a8 [38];
  undefined1 local_482;
  allocator local_481;
  string local_480 [32];
  vector<duckdb::LogicalType,_true> *local_460;
  undefined1 local_452;
  allocator local_451;
  string local_450 [32];
  string local_430 [32];
  string local_410 [38];
  undefined1 local_3ea;
  allocator local_3e9;
  string local_3e8 [32];
  double local_3c8;
  undefined1 local_3ba;
  allocator local_3b9;
  string local_3b8 [32];
  ulong local_398;
  undefined1 local_38a;
  allocator local_389;
  string local_388 [32];
  idx_t local_368;
  string local_350 [32];
  string local_330 [32];
  reference local_310;
  ulong local_308;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_300;
  undefined1 local_2e2;
  allocator local_2e1;
  string local_2e0 [32];
  LogicalType *local_2c0;
  const_reference local_2b8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  local_2b0;
  undefined1 local_2a8;
  undefined1 local_29a;
  allocator local_299;
  string local_298 [32];
  ulong local_278;
  undefined8 local_200;
  byte local_1f1;
  string local_1f0 [39];
  undefined1 local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  idx_t local_140;
  string local_138 [32];
  Value local_118 [71];
  undefined1 local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [48];
  string local_78 [32];
  reference local_58;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
  local_50;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_true>
  local_48;
  long local_40;
  byte local_2b;
  byte local_2a;
  byte local_29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  long *local_18;
  ClientContext *local_10;
  
  local_29 = 0;
  local_2a = 0;
  local_2b = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  make_uniq<duckdb::ParquetWriteBindData>();
  local_40 = *local_18 + 0xd0;
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
       ::begin(in_stack_fffffffffffff638);
  local_50._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
       ::end(in_stack_fffffffffffff638);
  while (bVar2 = std::__detail::operator!=(&local_48,&local_50), bVar2) {
    local_58 = std::__detail::
               _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_false,_true>
               ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_false,_true>
                            *)0x62a6a5);
    duckdb::StringUtil::Lower(local_78);
    sVar4 = std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::size
                      (&(local_58->second).
                        super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>);
    if (sVar4 != 1) {
      local_d1 = 1;
      uVar5 = __cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"%s requires exactly one argument",&local_a9);
      duckdb::StringUtil::Upper(local_d0);
      BinderException::BinderException<std::__cxx11::string>
                ((BinderException *)CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),
                 (string *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
      local_d1 = 0;
      __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
    }
    bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
    if ((bVar2) ||
       (bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638), bVar2)
       ) {
      vector<duckdb::Value,_true>::operator[]
                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                 (size_type)in_stack_fffffffffffff638);
      uVar10 = duckdb::Value::GetValue<unsigned_long>();
      pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                              *)in_stack_fffffffffffff640);
      pPVar15->row_group_size = uVar10;
      if ((local_2b & 1) == 0) {
        pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                  ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                *)in_stack_fffffffffffff640);
        ParquetWriteBindData::SetToDefaultDictionarySizeLimit(pPVar15);
      }
    }
    else {
      bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
      if (bVar2) {
        pvVar6 = vector<duckdb::Value,_true>::operator[]
                           ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                            (size_type)in_stack_fffffffffffff638);
        duckdb::Value::Value(local_118,pvVar6);
        pLVar8 = Value::GetTypeMutable(local_118);
        LVar3 = LogicalType::id(pLVar8);
        if (LVar3 == VARCHAR) {
          duckdb::Value::ToString_abi_cxx11_();
          iVar9 = duckdb::DBConfig::ParseMemoryLimit(local_138);
          pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                    ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                  *)in_stack_fffffffffffff640);
          pPVar15->row_group_size_bytes = iVar9;
          std::__cxx11::string::~string(local_138);
        }
        else {
          vector<duckdb::Value,_true>::operator[]
                    ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                     (size_type)in_stack_fffffffffffff638);
          uVar10 = duckdb::Value::GetValue<unsigned_long>();
          pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                    ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                  *)in_stack_fffffffffffff640);
          pPVar15->row_group_size_bytes = uVar10;
        }
        local_29 = 1;
        duckdb::Value::~Value(local_118);
      }
      else {
        bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
        if (bVar2) {
          vector<duckdb::Value,_true>::operator[]
                    ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                     (size_type)in_stack_fffffffffffff638);
          duckdb::Value::GetValue<unsigned_long>();
          optional_idx::optional_idx
                    ((optional_idx *)in_stack_fffffffffffff680,(idx_t)in_stack_fffffffffffff678);
          pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                    ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                  *)in_stack_fffffffffffff640);
          (pPVar15->row_groups_per_file).index = local_140;
        }
        else {
          bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
          if ((bVar2) ||
             (bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638),
             bVar2)) {
            vector<duckdb::Value,_true>::operator[]
                      ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                       (size_type)in_stack_fffffffffffff638);
            duckdb::Value::ToString_abi_cxx11_();
            duckdb::StringUtil::Lower(local_160);
            std::__cxx11::string::~string(local_180);
            bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
            if (bVar2) {
              pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                        ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                      *)in_stack_fffffffffffff640);
              pPVar15->codec = UNCOMPRESSED;
            }
            else {
              bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
              if (bVar2) {
                pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                          ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                        *)in_stack_fffffffffffff640);
                pPVar15->codec = SNAPPY;
              }
              else {
                bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638)
                ;
                if (bVar2) {
                  pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                            ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                          *)in_stack_fffffffffffff640);
                  pPVar15->codec = GZIP;
                }
                else {
                  bVar2 = std::operator==(in_stack_fffffffffffff640,
                                          (char *)in_stack_fffffffffffff638);
                  if (bVar2) {
                    pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                              ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                            *)in_stack_fffffffffffff640);
                    pPVar15->codec = ZSTD;
                  }
                  else {
                    bVar2 = std::operator==(in_stack_fffffffffffff640,
                                            (char *)in_stack_fffffffffffff638);
                    if (bVar2) {
                      pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                              *)in_stack_fffffffffffff640);
                      pPVar15->codec = BROTLI;
                    }
                    else {
                      bVar2 = std::operator==(in_stack_fffffffffffff640,
                                              (char *)in_stack_fffffffffffff638);
                      if ((!bVar2) &&
                         (bVar2 = std::operator==(in_stack_fffffffffffff640,
                                                  (char *)in_stack_fffffffffffff638), !bVar2)) {
                        local_1c9 = 1;
                        uVar5 = __cxa_allocate_exception(0x10);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_1a0,
                                   "Expected %s argument to be either [uncompressed, brotli, gzip, snappy, or zstd]"
                                   ,&local_1a1);
                        std::__cxx11::string::string(local_1c8,local_78);
                        BinderException::BinderException<std::__cxx11::string>
                                  ((BinderException *)
                                   CONCAT17(in_stack_fffffffffffff6b7,in_stack_fffffffffffff6b0),
                                   (string *)in_stack_fffffffffffff6a8,in_stack_fffffffffffff6a0);
                        local_1c9 = 0;
                        __cxa_throw(uVar5,&BinderException::typeinfo,
                                    BinderException::~BinderException);
                      }
                      pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                              *)in_stack_fffffffffffff640);
                      pPVar15->codec = LZ4_RAW;
                    }
                  }
                }
              }
            }
            std::__cxx11::string::~string(local_160);
          }
          else {
            bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
            if (bVar2) {
              local_1f1 = 0;
              pvVar6 = vector<duckdb::Value,_true>::operator[]
                                 ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                                  (size_type)in_stack_fffffffffffff638);
              pLVar8 = Value::type(pvVar6);
              LVar3 = LogicalType::id(pLVar8);
              local_6b2 = false;
              if (LVar3 == VARCHAR) {
                pvVar6 = vector<duckdb::Value,_true>::operator[]
                                   ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                                    (size_type)in_stack_fffffffffffff638);
                duckdb::StringValue::Get_abi_cxx11_(pvVar6);
                duckdb::StringUtil::Lower(local_1f0);
                local_1f1 = 1;
                local_6b2 = std::operator==(in_stack_fffffffffffff640,
                                            (char *)in_stack_fffffffffffff638);
              }
              if ((local_1f1 & 1) != 0) {
                std::__cxx11::string::~string(local_1f0);
              }
              if (local_6b2 == false) {
                std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                 *)0x62b20b);
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                 *)0x62b218);
                for (local_278 = 0; uVar10 = local_278,
                    sVar4 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::size(local_20), uVar10 < sVar4; local_278 = local_278 + 1) {
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)in_stack_fffffffffffff640,(size_type)in_stack_fffffffffffff638);
                  bVar2 = std::operator==(in_stack_fffffffffffff640,
                                          (char *)in_stack_fffffffffffff638);
                  if (bVar2) {
                    local_29a = 1;
                    uVar5 = __cxa_allocate_exception(0x10);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              (local_298,"Cannot have a column named \"%s\" when writing FIELD_IDS",
                               &local_299);
                    BinderException::BinderException<char_const*>
                              (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                               in_stack_fffffffffffff670);
                    local_29a = 0;
                    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
                  }
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                *)in_stack_fffffffffffff640,(size_type)in_stack_fffffffffffff638);
                  vector<duckdb::LogicalType,_true>::operator[]
                            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff640,
                             (size_type)in_stack_fffffffffffff638);
                  pVar17 = std::
                           unordered_map<std::__cxx11::string,duckdb::LogicalType,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>>
                           ::emplace<std::__cxx11::string_const&,duckdb::LogicalType_const&>
                                     (in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                                      (LogicalType *)in_stack_fffffffffffff640);
                  local_2b0._M_cur =
                       (__node_type *)
                       pVar17.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                       ._M_cur;
                  local_2a8 = pVar17.second;
                }
                vector<duckdb::Value,_true>::operator[]
                          ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                           (size_type)in_stack_fffffffffffff638);
                unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                              *)in_stack_fffffffffffff640);
                GetFieldIDs((Value *)CONCAT17(in_stack_fffffffffffffac7,
                                              CONCAT16(in_stack_fffffffffffffac6,
                                                       in_stack_fffffffffffffac0)),
                            in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                            in_stack_fffffffffffffaa8);
                std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                  *)0x62b4c3);
                std::
                unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)0x62b4d0);
              }
              else {
                local_200 = 0;
                unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                              *)in_stack_fffffffffffff640);
                GenerateFieldIDs(in_stack_fffffffffffff740,
                                 (idx_t *)CONCAT17(in_stack_fffffffffffff73f,
                                                   in_stack_fffffffffffff738),
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
              }
            }
            else {
              bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638);
              if (bVar2) {
                local_2b8 = vector<duckdb::Value,_true>::operator[]
                                      ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                                       (size_type)in_stack_fffffffffffff638);
                local_2c0 = Value::type(local_2b8);
                LVar3 = LogicalType::id(local_2c0);
                if (LVar3 != STRUCT) {
                  local_2e2 = 1;
                  pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_2e0,"Expected kv_metadata argument to be a STRUCT",&local_2e1);
                  duckdb::BinderException::BinderException(pBVar14,local_2e0);
                  local_2e2 = 0;
                  __cxa_throw(pBVar14,&BinderException::typeinfo,BinderException::~BinderException);
                }
                duckdb::StructValue::GetChildren(local_2b8);
                vector<duckdb::Value,_true>::vector
                          ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                           (vector<duckdb::Value,_true> *)in_stack_fffffffffffff638);
                for (local_308 = 0; uVar10 = local_308,
                    sVar4 = std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::size
                                      (&local_300), uVar10 < sVar4; local_308 = local_308 + 1) {
                  local_310 = vector<duckdb::Value,_true>::operator[]
                                        ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                                         (size_type)in_stack_fffffffffffff638);
                  psVar7 = (string *)
                           duckdb::StructType::GetChildName_abi_cxx11_(local_2c0,local_308);
                  std::__cxx11::string::string(local_330,psVar7);
                  pLVar8 = Value::type(local_310);
                  LVar3 = LogicalType::id(pLVar8);
                  if (LVar3 == BLOB) {
                    unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                    ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                  *)in_stack_fffffffffffff640);
                    duckdb::StringValue::Get_abi_cxx11_(local_310);
                    std::
                    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    ::emplace_back<std::__cxx11::string&,std::__cxx11::string_const&>
                              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                               in_stack_fffffffffffff640);
                  }
                  else {
                    unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                    ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                  *)in_stack_fffffffffffff640);
                    duckdb::Value::ToString_abi_cxx11_();
                    std::
                    vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                    ::emplace_back<std::__cxx11::string&,std::__cxx11::string>
                              ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)in_stack_fffffffffffff650,in_stack_fffffffffffff648,
                               in_stack_fffffffffffff640);
                    std::__cxx11::string::~string(local_350);
                  }
                  std::__cxx11::string::~string(local_330);
                }
                vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x62b905);
              }
              else {
                bVar2 = std::operator==(in_stack_fffffffffffff640,(char *)in_stack_fffffffffffff638)
                ;
                if (bVar2) {
                  vector<duckdb::Value,_true>::operator[]
                            ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                             (size_type)in_stack_fffffffffffff638);
                  ParquetEncryptionConfig::Create
                            (in_stack_fffffffffffff668,in_stack_fffffffffffff660);
                  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                  ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                *)in_stack_fffffffffffff640);
                  shared_ptr<duckdb::ParquetEncryptionConfig,_true>::operator=
                            ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)
                             in_stack_fffffffffffff650,
                             (shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)
                             in_stack_fffffffffffff648);
                  shared_ptr<duckdb::ParquetEncryptionConfig,_true>::~shared_ptr
                            ((shared_ptr<duckdb::ParquetEncryptionConfig,_true> *)0x62b9d7);
                }
                else {
                  bVar2 = std::operator==(in_stack_fffffffffffff640,
                                          (char *)in_stack_fffffffffffff638);
                  if (!bVar2) {
                    bVar2 = std::operator==(in_stack_fffffffffffff640,
                                            (char *)in_stack_fffffffffffff638);
                    if (bVar2) {
                      vector<duckdb::Value,_true>::operator[]
                                ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                                 (size_type)in_stack_fffffffffffff638);
                      iVar9 = duckdb::Value::GetValue<long>();
                      local_368 = iVar9;
                      if ((long)iVar9 < 0) {
                        local_38a = 1;
                        pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  (local_388,
                                   "dictionary_size_limit must be greater than 0 or 0 to disable",
                                   &local_389);
                        duckdb::BinderException::BinderException(pBVar14,local_388);
                        local_38a = 0;
                        __cxa_throw(pBVar14,&BinderException::typeinfo,
                                    BinderException::~BinderException);
                      }
                      pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                              *)in_stack_fffffffffffff640);
                      pPVar15->dictionary_size_limit = iVar9;
                      local_2b = 1;
                    }
                    else {
                      bVar2 = std::operator==(in_stack_fffffffffffff640,
                                              (char *)in_stack_fffffffffffff638);
                      if (bVar2) {
                        vector<duckdb::Value,_true>::operator[]
                                  ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                                   (size_type)in_stack_fffffffffffff638);
                        uVar10 = duckdb::Value::GetValue<unsigned_long>();
                        local_398 = uVar10;
                        if ((0x40000000 < uVar10) || (uVar10 == 0)) {
                          local_3ba = 1;
                          uVar5 = __cxa_allocate_exception(0x10);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    (local_3b8,
                                     "string_dictionary_page_size_limit cannot be 0 and must be less than or equal to %llu"
                                     ,&local_3b9);
                          BinderException::BinderException<unsigned_long>
                                    (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                                     (unsigned_long)in_stack_fffffffffffff670);
                          local_3ba = 0;
                          __cxa_throw(uVar5,&BinderException::typeinfo,
                                      BinderException::~BinderException);
                        }
                        pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                  ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                *)in_stack_fffffffffffff640);
                        pPVar15->string_dictionary_page_size_limit = uVar10;
                      }
                      else {
                        bVar2 = std::operator==(in_stack_fffffffffffff640,
                                                (char *)in_stack_fffffffffffff638);
                        if (bVar2) {
                          vector<duckdb::Value,_true>::operator[]
                                    ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                                     (size_type)in_stack_fffffffffffff638);
                          dVar16 = duckdb::Value::GetValue<double>();
                          local_3c8 = dVar16;
                          if (dVar16 <= 0.0) {
                            local_3ea = 1;
                            pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      (local_3e8,
                                       "bloom_filter_false_positive_ratio must be greater than 0",
                                       &local_3e9);
                            duckdb::BinderException::BinderException(pBVar14,local_3e8);
                            local_3ea = 0;
                            __cxa_throw(pBVar14,&BinderException::typeinfo,
                                        BinderException::~BinderException);
                          }
                          pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                    ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                  *)in_stack_fffffffffffff640);
                          pPVar15->bloom_filter_false_positive_ratio = dVar16;
                        }
                        else {
                          bVar2 = std::operator==(in_stack_fffffffffffff640,
                                                  (char *)in_stack_fffffffffffff638);
                          if (bVar2) {
                            vector<duckdb::Value,_true>::operator[]
                                      ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                                       (size_type)in_stack_fffffffffffff638);
                            duckdb::Value::GetValue<std::__cxx11::string>();
                            duckdb::StringUtil::Lower(local_410);
                            std::__cxx11::string::~string(local_430);
                            bVar2 = std::operator==(in_stack_fffffffffffff640,
                                                    (char *)in_stack_fffffffffffff638);
                            if (bVar2) {
                              pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                        ::operator->((
                                                  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                  *)in_stack_fffffffffffff640);
                              pPVar15->debug_use_openssl = false;
                            }
                            else {
                              bVar2 = std::operator==(in_stack_fffffffffffff640,
                                                      (char *)in_stack_fffffffffffff638);
                              if (!bVar2) {
                                local_452 = 1;
                                pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_450,"Expected debug_use_openssl to be a BOOLEAN",
                                           &local_451);
                                duckdb::BinderException::BinderException(pBVar14,local_450);
                                local_452 = 0;
                                __cxa_throw(pBVar14,&BinderException::typeinfo,
                                            BinderException::~BinderException);
                              }
                              pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                        ::operator->((
                                                  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                  *)in_stack_fffffffffffff640);
                              pPVar15->debug_use_openssl = true;
                            }
                            std::__cxx11::string::~string(local_410);
                          }
                          else {
                            in_stack_fffffffffffff73f =
                                 std::operator==(in_stack_fffffffffffff640,
                                                 (char *)in_stack_fffffffffffff638);
                            if ((bool)in_stack_fffffffffffff73f) {
                              in_stack_fffffffffffff730 =
                                   vector<duckdb::Value,_true>::operator[]
                                             ((vector<duckdb::Value,_true> *)
                                              in_stack_fffffffffffff640,
                                              (size_type)in_stack_fffffffffffff638);
                              pvVar11 = (vector<duckdb::LogicalType,_true> *)
                                        duckdb::Value::GetValue<long>();
                              in_stack_fffffffffffff728 = pvVar11;
                              local_460 = pvVar11;
                              iVar12 = ZStdFileSystem::MinimumCompressionLevel();
                              pvVar1 = local_460;
                              if (((long)pvVar11 < iVar12) ||
                                 (iVar12 = ZStdFileSystem::MaximumCompressionLevel(),
                                 pvVar11 = local_460, iVar12 < (long)pvVar1)) {
                                local_482 = 1;
                                uVar5 = __cxa_allocate_exception(0x10);
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_480,
                                           "Compression level must be between %lld and %lld",
                                           &local_481);
                                ZStdFileSystem::MinimumCompressionLevel();
                                ZStdFileSystem::MaximumCompressionLevel();
                                BinderException::BinderException<long,long>
                                          (in_stack_fffffffffffff690,in_stack_fffffffffffff688,
                                           (long)in_stack_fffffffffffff680,
                                           (long)in_stack_fffffffffffff678);
                                local_482 = 0;
                                __cxa_throw(uVar5,&BinderException::typeinfo,
                                            BinderException::~BinderException);
                              }
                              pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                        ::operator->((
                                                  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                  *)in_stack_fffffffffffff640);
                              pPVar15->compression_level = (int64_t)pvVar11;
                              local_2a = 1;
                            }
                            else {
                              bVar2 = std::operator==(in_stack_fffffffffffff640,
                                                      (char *)in_stack_fffffffffffff638);
                              if (!bVar2) {
                                local_512 = 1;
                                uVar5 = __cxa_allocate_exception(0x10);
                                paVar18 = &local_511;
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          (local_510,"Unrecognized option for PARQUET: %s",paVar18);
                                std::__cxx11::string::c_str();
                                NotImplementedException::NotImplementedException<char_const*>
                                          ((NotImplementedException *)in_stack_fffffffffffff680,
                                           in_stack_fffffffffffff678,in_stack_fffffffffffff670);
                                local_512 = 0;
                                __cxa_throw(uVar5,&NotImplementedException::typeinfo,
                                            NotImplementedException::~NotImplementedException);
                              }
                              vector<duckdb::Value,_true>::operator[]
                                        ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff640,
                                         (size_type)in_stack_fffffffffffff638);
                              duckdb::Value::ToString_abi_cxx11_();
                              duckdb::StringUtil::Upper(local_4a8);
                              std::__cxx11::string::~string(local_4c8);
                              bVar2 = std::operator==(in_stack_fffffffffffff640,
                                                      (char *)in_stack_fffffffffffff638);
                              if (bVar2) {
                                pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                          ::operator->((
                                                  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                  *)in_stack_fffffffffffff640);
                                pPVar15->parquet_version = V1;
                              }
                              else {
                                in_stack_fffffffffffff6b7 =
                                     std::operator==(in_stack_fffffffffffff640,
                                                     (char *)in_stack_fffffffffffff638);
                                if (!(bool)in_stack_fffffffffffff6b7) {
                                  local_4ea = 1;
                                  pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
                                  paVar18 = &local_4e9;
                                  std::allocator<char>::allocator();
                                  std::__cxx11::string::string
                                            (local_4e8,"Expected parquet_version \'V1\' or \'V2\'",
                                             paVar18);
                                  duckdb::BinderException::BinderException(pBVar14,local_4e8);
                                  local_4ea = 0;
                                  __cxa_throw(pBVar14,&BinderException::typeinfo,
                                              BinderException::~BinderException);
                                }
                                in_stack_fffffffffffff6a8 =
                                     unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                     ::operator->((
                                                  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                                                  *)in_stack_fffffffffffff640);
                                in_stack_fffffffffffff6a8->parquet_version = V2;
                              }
                              std::__cxx11::string::~string(local_4a8);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_78);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_false,_true>
    ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_false,_true>
                  *)in_stack_fffffffffffff640);
  }
  if (((local_29 & 1) != 0) &&
     (lVar13 = duckdb::DBConfig::GetConfig(local_10), (*(byte *)(lVar13 + 0x2b8) & 1) != 0)) {
    pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
    paVar18 = (allocator *)&stack0xfffffffffffffac7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_538,
               "ROW_GROUP_SIZE_BYTES does not work while preserving insertion order. Use \"SET preserve_insertion_order=false;\" to disable preserving insertion order."
               ,paVar18);
    duckdb::BinderException::BinderException(pBVar14,local_538);
    __cxa_throw(pBVar14,&BinderException::typeinfo,BinderException::~BinderException);
  }
  if (((local_2a & 1) != 0) &&
     (pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                              *)in_stack_fffffffffffff640), pPVar15->codec != ZSTD)) {
    pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
    paVar18 = &local_561;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_560,"Compression level is only supported for the ZSTD compression codec",
               paVar18);
    duckdb::BinderException::BinderException(pBVar14,local_560);
    __cxa_throw(pBVar14,&BinderException::typeinfo,BinderException::~BinderException);
  }
  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
  ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                *)in_stack_fffffffffffff640);
  vector<duckdb::LogicalType,_true>::operator=
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff640,
             (vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffff638);
  pPVar15 = unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
            ::operator->((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                          *)in_stack_fffffffffffff640);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)pPVar15,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)local_20);
  unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>::
  unique_ptr<duckdb::ParquetWriteBindData,std::default_delete<std::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>>>,void>
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             pPVar15,(unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>_>
                      *)local_20);
  unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
  ::~unique_ptr((unique_ptr<duckdb::ParquetWriteBindData,_std::default_delete<duckdb::ParquetWriteBindData>,_true>
                 *)0x62ca78);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (__uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<FunctionData> ParquetWriteBind(ClientContext &context, CopyFunctionBindInput &input,
                                          const vector<string> &names, const vector<LogicalType> &sql_types) {
	D_ASSERT(names.size() == sql_types.size());
	bool row_group_size_bytes_set = false;
	bool compression_level_set = false;
	bool dictionary_size_limit_set = false;
	auto bind_data = make_uniq<ParquetWriteBindData>();
	for (auto &option : input.info.options) {
		const auto loption = StringUtil::Lower(option.first);
		if (option.second.size() != 1) {
			// All parquet write options require exactly one argument
			throw BinderException("%s requires exactly one argument", StringUtil::Upper(loption));
		}
		if (loption == "row_group_size" || loption == "chunk_size") {
			bind_data->row_group_size = option.second[0].GetValue<uint64_t>();
			if (!dictionary_size_limit_set) {
				bind_data->SetToDefaultDictionarySizeLimit();
			}
		} else if (loption == "row_group_size_bytes") {
			auto roption = option.second[0];
			if (roption.GetTypeMutable().id() == LogicalTypeId::VARCHAR) {
				bind_data->row_group_size_bytes = DBConfig::ParseMemoryLimit(roption.ToString());
			} else {
				bind_data->row_group_size_bytes = option.second[0].GetValue<uint64_t>();
			}
			row_group_size_bytes_set = true;
		} else if (loption == "row_groups_per_file") {
			bind_data->row_groups_per_file = option.second[0].GetValue<uint64_t>();
		} else if (loption == "compression" || loption == "codec") {
			const auto roption = StringUtil::Lower(option.second[0].ToString());
			if (roption == "uncompressed") {
				bind_data->codec = duckdb_parquet::CompressionCodec::UNCOMPRESSED;
			} else if (roption == "snappy") {
				bind_data->codec = duckdb_parquet::CompressionCodec::SNAPPY;
			} else if (roption == "gzip") {
				bind_data->codec = duckdb_parquet::CompressionCodec::GZIP;
			} else if (roption == "zstd") {
				bind_data->codec = duckdb_parquet::CompressionCodec::ZSTD;
			} else if (roption == "brotli") {
				bind_data->codec = duckdb_parquet::CompressionCodec::BROTLI;
			} else if (roption == "lz4" || roption == "lz4_raw") {
				/* LZ4 is technically another compression scheme, but deprecated and arrow also uses them
				 * interchangeably */
				bind_data->codec = duckdb_parquet::CompressionCodec::LZ4_RAW;
			} else {
				throw BinderException("Expected %s argument to be either [uncompressed, brotli, gzip, snappy, or zstd]",
				                      loption);
			}
		} else if (loption == "field_ids") {
			if (option.second[0].type().id() == LogicalTypeId::VARCHAR &&
			    StringUtil::Lower(StringValue::Get(option.second[0])) == "auto") {
				idx_t field_id = 0;
				GenerateFieldIDs(bind_data->field_ids, field_id, names, sql_types);
			} else {
				unordered_set<uint32_t> unique_field_ids;
				case_insensitive_map_t<LogicalType> name_to_type_map;
				for (idx_t col_idx = 0; col_idx < names.size(); col_idx++) {
					if (names[col_idx] == FieldID::DUCKDB_FIELD_ID) {
						throw BinderException("Cannot have a column named \"%s\" when writing FIELD_IDS",
						                      FieldID::DUCKDB_FIELD_ID);
					}
					name_to_type_map.emplace(names[col_idx], sql_types[col_idx]);
				}
				GetFieldIDs(option.second[0], bind_data->field_ids, unique_field_ids, name_to_type_map);
			}
		} else if (loption == "kv_metadata") {
			auto &kv_struct = option.second[0];
			auto &kv_struct_type = kv_struct.type();
			if (kv_struct_type.id() != LogicalTypeId::STRUCT) {
				throw BinderException("Expected kv_metadata argument to be a STRUCT");
			}
			auto values = StructValue::GetChildren(kv_struct);
			for (idx_t i = 0; i < values.size(); i++) {
				auto &value = values[i];
				auto key = StructType::GetChildName(kv_struct_type, i);
				// If the value is a blob, write the raw blob bytes
				// otherwise, cast to string
				if (value.type().id() == LogicalTypeId::BLOB) {
					bind_data->kv_metadata.emplace_back(key, StringValue::Get(value));
				} else {
					bind_data->kv_metadata.emplace_back(key, value.ToString());
				}
			}
		} else if (loption == "encryption_config") {
			bind_data->encryption_config = ParquetEncryptionConfig::Create(context, option.second[0]);
		} else if (loption == "dictionary_compression_ratio_threshold") {
			// deprecated, ignore setting
		} else if (loption == "dictionary_size_limit") {
			auto val = option.second[0].GetValue<int64_t>();
			if (val < 0) {
				throw BinderException("dictionary_size_limit must be greater than 0 or 0 to disable");
			}
			bind_data->dictionary_size_limit = val;
			dictionary_size_limit_set = true;
		} else if (loption == "string_dictionary_page_size_limit") {
			auto val = option.second[0].GetValue<uint64_t>();
			if (val > PrimitiveColumnWriter::MAX_UNCOMPRESSED_DICT_PAGE_SIZE || val == 0) {
				throw BinderException(
				    "string_dictionary_page_size_limit cannot be 0 and must be less than or equal to %llu",
				    PrimitiveColumnWriter::MAX_UNCOMPRESSED_DICT_PAGE_SIZE);
			}
			bind_data->string_dictionary_page_size_limit = val;
		} else if (loption == "bloom_filter_false_positive_ratio") {
			auto val = option.second[0].GetValue<double>();
			if (val <= 0) {
				throw BinderException("bloom_filter_false_positive_ratio must be greater than 0");
			}
			bind_data->bloom_filter_false_positive_ratio = val;
		} else if (loption == "debug_use_openssl") {
			auto val = StringUtil::Lower(option.second[0].GetValue<std::string>());
			if (val == "false") {
				bind_data->debug_use_openssl = false;
			} else if (val == "true") {
				bind_data->debug_use_openssl = true;
			} else {
				throw BinderException("Expected debug_use_openssl to be a BOOLEAN");
			}
		} else if (loption == "compression_level") {
			const auto val = option.second[0].GetValue<int64_t>();
			if (val < ZStdFileSystem::MinimumCompressionLevel() || val > ZStdFileSystem::MaximumCompressionLevel()) {
				throw BinderException("Compression level must be between %lld and %lld",
				                      ZStdFileSystem::MinimumCompressionLevel(),
				                      ZStdFileSystem::MaximumCompressionLevel());
			}
			bind_data->compression_level = val;
			compression_level_set = true;
		} else if (loption == "parquet_version") {
			const auto roption = StringUtil::Upper(option.second[0].ToString());
			if (roption == "V1") {
				bind_data->parquet_version = ParquetVersion::V1;
			} else if (roption == "V2") {
				bind_data->parquet_version = ParquetVersion::V2;
			} else {
				throw BinderException("Expected parquet_version 'V1' or 'V2'");
			}
		} else {
			throw NotImplementedException("Unrecognized option for PARQUET: %s", option.first.c_str());
		}
	}
	if (row_group_size_bytes_set) {
		if (DBConfig::GetConfig(context).options.preserve_insertion_order) {
			throw BinderException("ROW_GROUP_SIZE_BYTES does not work while preserving insertion order. Use \"SET "
			                      "preserve_insertion_order=false;\" to disable preserving insertion order.");
		}
	}

	if (compression_level_set && bind_data->codec != CompressionCodec::ZSTD) {
		throw BinderException("Compression level is only supported for the ZSTD compression codec");
	}

	bind_data->sql_types = sql_types;
	bind_data->column_names = names;
	return std::move(bind_data);
}